

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdLoad.c
# Opt level: O0

int CmdCommandLoad(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Vec_Str_t *p;
  char *pcVar2;
  FILE *__stream;
  int local_3c;
  int i;
  FILE *pFile;
  Vec_Str_t *vCommand;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p = Vec_StrAlloc(100);
  Vec_StrAppend(p,"abccmd_");
  Vec_StrAppend(p,*argv);
  Vec_StrAppend(p,".exe");
  Vec_StrPush(p,'\0');
  pcVar2 = Vec_StrArray(p);
  __stream = fopen(pcVar2,"r");
  if (__stream == (FILE *)0x0) {
    Vec_StrFree(p);
    pcVar2 = Vec_StrArray(p);
    Abc_Print(-1,"Cannot run the binary \"%s\".\n\n",pcVar2);
    pAbc_local._4_4_ = 1;
  }
  else {
    fclose(__stream);
    Vec_StrPop(p);
    for (local_3c = 1; local_3c < argc; local_3c = local_3c + 1) {
      Vec_StrAppend(p," ");
      Vec_StrAppend(p,argv[local_3c]);
    }
    Vec_StrPush(p,'\0');
    pcVar2 = Vec_StrArray(p);
    iVar1 = Util_SignalSystem(pcVar2);
    if (iVar1 == 0) {
      Vec_StrFree(p);
      pAbc_local._4_4_ = 0;
    }
    else {
      Vec_StrFree(p);
      Abc_Print(-1,"The following command has returned non-zero exit status:\n");
      pcVar2 = Vec_StrArray(p);
      Abc_Print(-1,"\"%s\"\n",pcVar2);
      pAbc_local._4_4_ = 1;
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function********************************************************************

  Synopsis    []

  Description []

  SideEffects []

  SeeAlso     []

******************************************************************************/
int CmdCommandLoad( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Str_t * vCommand;
    FILE * pFile;
    int i;
    vCommand = Vec_StrAlloc( 100 );
    Vec_StrAppend( vCommand, "abccmd_" );
    Vec_StrAppend( vCommand, argv[0] );
    Vec_StrAppend( vCommand, ".exe" );
    Vec_StrPush( vCommand, 0 );
    // check if there is the binary
    if ( (pFile = fopen( Vec_StrArray(vCommand), "r" )) == NULL )
    {
        Vec_StrFree( vCommand );
        Abc_Print( -1, "Cannot run the binary \"%s\".\n\n", Vec_StrArray(vCommand) );
        return 1;
    }
    fclose( pFile );
    Vec_StrPop( vCommand );
    // add other arguments
    for ( i = 1; i < argc; i++ )
    {
        Vec_StrAppend( vCommand, " " );
        Vec_StrAppend( vCommand, argv[i] );
    }
    Vec_StrPush( vCommand, 0 );
    // run the command line
    if ( Util_SignalSystem( Vec_StrArray(vCommand) ) )
    {
        Vec_StrFree( vCommand );
        Abc_Print( -1, "The following command has returned non-zero exit status:\n" );
        Abc_Print( -1, "\"%s\"\n", Vec_StrArray(vCommand) );
        return 1;
    }
    Vec_StrFree( vCommand );
    return 0;
}